

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inline.cpp
# Opt level: O3

void __thiscall
Inline::AdjustArgoutsForCallTargetInlining
          (Inline *this,Instr *callInstr,Instr **pExplicitThisArgOut,bool isCallInstanceFunction)

{
  int iVar1;
  _func_int **pp_Var2;
  Func *pFVar3;
  code *pcVar4;
  bool bVar5;
  OpndKind OVar6;
  byte bVar7;
  ArgSlot AVar8;
  uint uVar9;
  uint uVar10;
  undefined4 *puVar11;
  StackSym *pSVar12;
  Instr *this_00;
  Instr *pIVar13;
  Instr *pIVar14;
  Opnd *pOVar15;
  IntConstOpnd *pIVar16;
  uint uVar17;
  Instr *functionArg;
  Instr *this_01;
  Instr *pIVar18;
  Instr *pIVar19;
  Instr *pIVar20;
  undefined4 *local_48;
  
  if (pExplicitThisArgOut == (Instr **)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0xd73,"(pExplicitThisArgOut)","pExplicitThisArgOut");
    if (!bVar5) goto LAB_00554e12;
    *puVar11 = 0;
  }
  pSVar12 = IR::Opnd::GetStackSym(callInstr->m_src2);
  pIVar13 = (pSVar12->field_5).m_instrDef;
  if ((pIVar13 != (Instr *)0x0 & pSVar12->field_0x18) == 1) {
    local_48 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  }
  else {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    local_48 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *local_48 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                       ,0x1af,"(linkSym->IsSingleDef())","linkSym->IsSingleDef()");
    if (!bVar5) goto LAB_00554e12;
    *local_48 = 0;
    pIVar13 = (pSVar12->field_5).m_instrDef;
  }
  pIVar14 = (Instr *)0x0;
  pIVar18 = (Instr *)0x0;
  pIVar20 = (Instr *)0x0;
  do {
    if ((pIVar13->m_src2 == (Opnd *)0x0) ||
       (OVar6 = IR::Opnd::GetKind(pIVar13->m_src2), OVar6 != OpndKindSym)) {
      pIVar19 = (Instr *)0x0;
    }
    else {
      pOVar15 = pIVar13->m_src2;
      OVar6 = IR::Opnd::GetKind(pOVar15);
      if (OVar6 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *local_48 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar5) goto LAB_00554e12;
        *local_48 = 0;
      }
      pp_Var2 = pOVar15[1]._vptr_Opnd;
      if (*(char *)((long)pp_Var2 + 0x14) != '\x01') {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *local_48 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x1f,"(this->IsStackSym())","Bad call to AsStackSym()");
        if (!bVar5) goto LAB_00554e12;
        *local_48 = 0;
      }
      uVar9 = *(uint *)(pp_Var2 + 3);
      uVar17 = uVar9 & 0x100000;
      if ((uVar17 != 0) && (*(short *)((long)pp_Var2 + 0x16) == 0)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *local_48 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Sym.inl"
                           ,0x5b,"(this->m_slotNum != 0)","this->m_slotNum != 0");
        if (!bVar5) goto LAB_00554e12;
        *local_48 = 0;
        uVar9 = *(uint *)(pp_Var2 + 3);
        uVar17 = uVar9 & 0x100000;
      }
      if (uVar17 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *local_48 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                           ,0x1b8,"(linkSym->IsArgSlotSym())","linkSym->IsArgSlotSym()");
        if (!bVar5) goto LAB_00554e12;
        *local_48 = 0;
        uVar9 = *(uint *)(pp_Var2 + 3);
      }
      if (((((uVar9 & 1) == 0) || (pp_Var2[5] == (_func_int *)0x0)) &&
          (bVar5 = Func::IsInPhase(callInstr->m_func,FGPeepsPhase), !bVar5)) &&
         (bVar5 = Func::IsInPhase(callInstr->m_func,FGBuildPhase), !bVar5)) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *local_48 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                           ,0x1bf,
                           "(linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase)))"
                           ,
                           "linkSym->IsSingleDef() || (m_func->IsInPhase(Js::Phase::FGPeepsPhase) || m_func->IsInPhase(Js::Phase::FGBuildPhase))"
                          );
        if (!bVar5) goto LAB_00554e12;
        *local_48 = 0;
      }
      if (((ulong)pp_Var2[3] & 1) == 0) {
        pIVar19 = (Instr *)0x0;
      }
      else {
        pIVar19 = (Instr *)pp_Var2[5];
      }
    }
    this_00 = pIVar20;
    this_01 = pIVar18;
    if (pIVar13->m_opcode != ArgOut_A_InlineSpecialized) {
      if (pIVar13->m_opcode == StartCall) {
        if (pIVar19 != (Instr *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *local_48 = 1;
          bVar5 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.h"
                             ,0x1ce,"(nextArg == nullptr)","nextArg == nullptr");
          if (!bVar5) goto LAB_00554e12;
          *local_48 = 0;
        }
        break;
      }
      IR::Instr::GenerateBytecodeArgOutCapture(pIVar13);
      pOVar15 = pIVar13->m_dst;
      OVar6 = IR::Opnd::GetKind(pOVar15);
      if (OVar6 != OpndKindSym) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *local_48 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                           ,0x45,"(this->IsSymOpnd())","Bad call to AsSymOpnd()");
        if (!bVar5) goto LAB_00554e12;
        *local_48 = 0;
      }
      pSVar12 = IR::Opnd::GetStackSym(pOVar15);
      iVar1 = pSVar12->m_offset;
      AVar8 = StackSym::GetArgSlotNum(pSVar12);
      if (iVar1 != (uint)AVar8 * 8 + -8) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *local_48 = 1;
        bVar5 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                           ,0xd84,"(argSym->m_offset == (argSym->GetArgSlotNum() - 1) * MachPtr)",
                           "argSym->m_offset == (argSym->GetArgSlotNum() - 1) * MachPtr");
        if (!bVar5) goto LAB_00554e12;
        *local_48 = 0;
      }
      StackSym::DecrementArgSlotNum(pSVar12);
      AVar8 = StackSym::GetArgSlotNum(pSVar12);
      if (AVar8 != 0) {
        Func::SetArgOffset(this->topFunc,pSVar12,pSVar12->m_offset + -8);
      }
      this_00 = pIVar13;
      this_01 = pIVar20;
      pIVar14 = pIVar18;
      if ((isCallInstanceFunction) && (AVar8 = StackSym::GetArgSlotNum(pSVar12), AVar8 != 0)) {
        StackSym::DecrementArgSlotNum(pSVar12);
      }
    }
    pIVar18 = this_01;
    pIVar13 = pIVar19;
    pIVar20 = this_00;
  } while (pIVar19 != (Instr *)0x0);
  if (!isCallInstanceFunction) {
    pIVar14 = this_01;
  }
  if (pIVar14 == (Instr *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0xd96,"(explicitThisArgOut)","explicitThisArgOut");
    if (!bVar5) goto LAB_00554e12;
    *puVar11 = 0;
  }
  bVar5 = IR::Instr::HasByteCodeArgOutCapture(pIVar14);
  if (!bVar5) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0xd97,"(explicitThisArgOut->HasByteCodeArgOutCapture())",
                       "explicitThisArgOut->HasByteCodeArgOutCapture()");
    if (!bVar5) goto LAB_00554e12;
    *puVar11 = 0;
  }
  pOVar15 = this_00->m_src2;
  OVar6 = IR::Opnd::GetKind(pOVar15);
  if (OVar6 == OpndKindReg) {
    OVar6 = IR::Opnd::GetKind(pOVar15);
    if (OVar6 != OpndKindReg) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
      if (!bVar5) goto LAB_00554e12;
      *puVar11 = 0;
    }
    pSVar12 = IR::Opnd::GetStackSym(pOVar15);
    if (((pSVar12->field_0x18 & 1) == 0) || ((pSVar12->field_5).m_instrDef == (Instr *)0x0))
    goto LAB_0055482e;
  }
  else {
LAB_0055482e:
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0xd9b,
                       "(linkOpnd->IsRegOpnd() && linkOpnd->AsRegOpnd()->GetStackSym()->IsSingleDef())"
                       ,
                       "linkOpnd->IsRegOpnd() && linkOpnd->AsRegOpnd()->GetStackSym()->IsSingleDef()"
                      );
    if (!bVar5) goto LAB_00554e12;
    *puVar11 = 0;
  }
  OVar6 = IR::Opnd::GetKind(pOVar15);
  if (OVar6 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar5) goto LAB_00554e12;
    *puVar11 = 0;
  }
  pSVar12 = IR::Opnd::GetStackSym(pOVar15);
  if ((pSVar12->field_0x18 & 1) == 0) {
    pIVar13 = (Instr *)0x0;
  }
  else {
    pIVar13 = (pSVar12->field_5).m_instrDef;
  }
  if (pIVar13->m_opcode != StartCall) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Inline.cpp"
                       ,0xd9c,
                       "(linkOpnd->AsRegOpnd()->GetStackSym()->GetInstrDef()->m_opcode == Js::OpCode::StartCall)"
                       ,
                       "linkOpnd->AsRegOpnd()->GetStackSym()->GetInstrDef()->m_opcode == Js::OpCode::StartCall"
                      );
    if (!bVar5) goto LAB_00554e12;
    *puVar11 = 0;
  }
  OVar6 = IR::Opnd::GetKind(pOVar15);
  if (OVar6 != OpndKindReg) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x79,"(this->IsRegOpnd())","Bad call to AsRegOpnd()");
    if (!bVar5) goto LAB_00554e12;
    *puVar11 = 0;
  }
  pSVar12 = IR::Opnd::GetStackSym(pOVar15);
  if ((pSVar12->field_0x18 & 1) == 0) {
    pIVar13 = (Instr *)0x0;
  }
  else {
    pIVar13 = (pSVar12->field_5).m_instrDef;
  }
  IR::Instr::ReplaceSrc2(pIVar14,pIVar13->m_dst);
  *pExplicitThisArgOut = pIVar14;
  if (isCallInstanceFunction) {
    pIVar14 = IR::Instr::New(BytecodeArgOutUse,callInstr->m_func,callInstr);
    IR::Instr::ReplaceSrc1(callInstr,this_01->m_src1);
    pOVar15 = this_01->m_src1;
    if (pIVar14->m_src1 != (Opnd *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
      if (!bVar5) goto LAB_00554e12;
      *puVar11 = 0;
    }
    pFVar3 = pIVar14->m_func;
    if (pOVar15->isDeleted == true) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar11 = 1;
      bVar5 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                         ,0x14,"(!isDeleted)","Using deleted operand");
      if (!bVar5) goto LAB_00554e12;
      *puVar11 = 0;
    }
    bVar7 = pOVar15->field_0xb;
    if ((bVar7 & 2) != 0) {
      pOVar15 = IR::Opnd::Copy(pOVar15,pFVar3);
      bVar7 = pOVar15->field_0xb;
    }
    pOVar15->field_0xb = bVar7 | 2;
    pIVar14->m_src1 = pOVar15;
    IR::Instr::InsertBefore(callInstr,pIVar14);
    IR::Instr::Remove(this_01);
  }
  pIVar14 = IR::Instr::New(BytecodeArgOutUse,callInstr->m_func,callInstr);
  pOVar15 = this_00->m_src1;
  if (pIVar14->m_src1 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x16c,"(this->m_src1 == __null)","Trying to overwrite existing src.");
    if (!bVar5) goto LAB_00554e12;
    *puVar11 = 0;
  }
  pFVar3 = pIVar14->m_func;
  if (pOVar15->isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar5) goto LAB_00554e12;
    *puVar11 = 0;
  }
  bVar7 = pOVar15->field_0xb;
  if ((bVar7 & 2) != 0) {
    pOVar15 = IR::Opnd::Copy(pOVar15,pFVar3);
    bVar7 = pOVar15->field_0xb;
  }
  pOVar15->field_0xb = bVar7 | 2;
  pIVar14->m_src1 = pOVar15;
  IR::Instr::InsertBefore(callInstr,pIVar14);
  IR::Instr::Remove(this_00);
  uVar10 = IR::Instr::GetArgOutCount(pIVar13,false);
  pIVar16 = IR::IntConstOpnd::New((ulong)uVar10,TyUint32,pIVar13->m_func,false);
  if (pIVar13->m_src2 != (Opnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                       ,0x18b,"(this->m_src2 == __null)","Trying to overwrite existing src.");
    if (!bVar5) goto LAB_00554e12;
    *puVar11 = 0;
  }
  pFVar3 = pIVar13->m_func;
  if ((pIVar16->super_Opnd).isDeleted == true) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0x14,"(!isDeleted)","Using deleted operand");
    if (!bVar5) goto LAB_00554e12;
    *puVar11 = 0;
  }
  bVar7 = (pIVar16->super_Opnd).field_0xb;
  if ((bVar7 & 2) != 0) {
    pIVar16 = (IntConstOpnd *)IR::Opnd::Copy(&pIVar16->super_Opnd,pFVar3);
    bVar7 = (pIVar16->super_Opnd).field_0xb;
  }
  (pIVar16->super_Opnd).field_0xb = bVar7 | 2;
  pIVar13->m_src2 = &pIVar16->super_Opnd;
  pIVar16 = (IntConstOpnd *)pIVar13->m_src1;
  OVar6 = IR::Opnd::GetKind((Opnd *)pIVar16);
  if (OVar6 != OpndKindIntConst) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
    if (!bVar5) goto LAB_00554e12;
    *puVar11 = 0;
  }
  pOVar15 = pIVar13->m_src1;
  OVar6 = IR::Opnd::GetKind(pOVar15);
  if (OVar6 != OpndKindIntConst) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar11 = 1;
    bVar5 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Opnd.inl"
                       ,0xc0,"(this->IsIntConstOpnd())","Bad call to AsIntConstOpnd()");
    if (!bVar5) {
LAB_00554e12:
      pcVar4 = (code *)invalidInstructionException();
      (*pcVar4)();
    }
    *puVar11 = 0;
  }
  IR::IntConstOpnd::SetValue(pIVar16,~(ulong)isCallInstanceFunction + (long)pOVar15[1]._vptr_Opnd);
  return;
}

Assistant:

void
Inline::AdjustArgoutsForCallTargetInlining(IR::Instr* callInstr, IR::Instr ** pExplicitThisArgOut, bool isCallInstanceFunction)
{
    Assert(pExplicitThisArgOut);

    IR::Instr * firstArgOut = nullptr;
    IR::Instr * secondArgOut = nullptr;
    IR::Instr * thirdArgOut = nullptr;

    callInstr->IterateArgInstrs([&](IR::Instr* argInstr)
    {
        thirdArgOut = secondArgOut;
        secondArgOut = firstArgOut;
        firstArgOut = argInstr;

        argInstr->GenerateBytecodeArgOutCapture(); // Generate BytecodeArgOutCapture here to capture the implicit "this" argout (which will be removed) as well,
                                                   // so that any bailout in the call sequence restores the argouts stack as the interpreter would expect it to be.

        StackSym * argSym = argInstr->GetDst()->AsSymOpnd()->GetStackSym();
        
        Assert(argSym->m_offset == (argSym->GetArgSlotNum() - 1) * MachPtr);
        argSym->DecrementArgSlotNum(); // We will be removing implicit "this" argout
        if (argSym->GetArgSlotNum() != 0)
        {
            this->topFunc->SetArgOffset(argSym, argSym->m_offset - MachPtr);
        }

        if (isCallInstanceFunction && argSym->GetArgSlotNum() != 0)
        {
            argSym->DecrementArgSlotNum(); // We will also be removing the function argout
        }

        return false;
    });

    IR::Instr * implicitThisArgOut = firstArgOut;
    IR::Instr * explicitThisArgOut = isCallInstanceFunction ? thirdArgOut : secondArgOut;

    Assert(explicitThisArgOut);
    Assert(explicitThisArgOut->HasByteCodeArgOutCapture());


    IR::Opnd* linkOpnd = implicitThisArgOut->GetSrc2();
    Assert(linkOpnd->IsRegOpnd() && linkOpnd->AsRegOpnd()->GetStackSym()->IsSingleDef());
    Assert(linkOpnd->AsRegOpnd()->GetStackSym()->GetInstrDef()->m_opcode == Js::OpCode::StartCall);

    IR::Instr* startCall = linkOpnd->AsRegOpnd()->GetStackSym()->GetInstrDef();

    explicitThisArgOut->ReplaceSrc2(startCall->GetDst());
    *pExplicitThisArgOut = explicitThisArgOut;

    if (isCallInstanceFunction)
    {
        IR::Instr * functionArg = secondArgOut;
        IR::Instr * bytecodeArgOutUse = IR::Instr::New(Js::OpCode::BytecodeArgOutUse, callInstr->m_func, callInstr);
        callInstr->ReplaceSrc1(functionArg->GetSrc1());
        bytecodeArgOutUse->SetSrc1(functionArg->GetSrc1());
        callInstr->InsertBefore(bytecodeArgOutUse); // Need to keep the function argout live till the call instruction for it to be captured by any bailout in the call sequence.
        functionArg->Remove();
    }

    IR::Instr * bytecodeArgOutUse = IR::Instr::New(Js::OpCode::BytecodeArgOutUse, callInstr->m_func, callInstr);
    bytecodeArgOutUse->SetSrc1(implicitThisArgOut->GetSrc1());
    callInstr->InsertBefore(bytecodeArgOutUse); // Need to keep the implicit "this" argout live till the call instruction for it to be captured by any bailout in the call sequence.
    implicitThisArgOut->Remove();

    startCall->SetSrc2(IR::IntConstOpnd::New(startCall->GetArgOutCount(/*getInterpreterArgOutCount*/ false), TyUint32, startCall->m_func));

    uint argsRemoved = isCallInstanceFunction ? 2 : 1;
    startCall->GetSrc1()->AsIntConstOpnd()->SetValue(startCall->GetSrc1()->AsIntConstOpnd()->GetValue() - argsRemoved);
}